

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

void deqp::sl::genCompareFunctions(ostringstream *stream,ValueBlock *valueBlock,bool useFloatTypes)

{
  pointer pVVar1;
  int i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  bool cmpTypeFound [94];
  
  for (lVar2 = 0; lVar2 != 0x5e; lVar2 = lVar2 + 1) {
    cmpTypeFound[lVar2] = false;
  }
  pVVar1 = (valueBlock->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(valueBlock->values).
                 super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x48;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 * 0x48 - uVar5 != 0; uVar5 = uVar5 + 0x48) {
    if (*(int *)((long)&pVVar1->storageType + uVar5) == 2) {
      cmpTypeFound[*(int *)((long)&pVVar1->dataType + uVar5)] = true;
    }
  }
  if (useFloatTypes) {
    if (cmpTypeFound[0x23] != false) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (float a, bool b) { return ((a > 0.5) == b); }\n");
    }
    if (cmpTypeFound[0x24] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec2 a, bvec2 b) { return (greaterThan(a, vec2(0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x25] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec3 a, bvec3 b) { return (greaterThan(a, vec3(0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x26] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec4 a, bvec4 b) { return (greaterThan(a, vec4(0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x1b] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (float a, int b)  { float atemp = a+0.5; return (float(b) <= atemp && atemp <= float(b+1)); }\n"
                     );
    }
    if (cmpTypeFound[0x1c] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec2 a, ivec2 b) { return (ivec2(floor(a + 0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x1d] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec3 a, ivec3 b) { return (ivec3(floor(a + 0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x1e] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec4 a, ivec4 b) { return (ivec4(floor(a + 0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x1f] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (float a, uint b) { float atemp = a+0.5; return (float(b) <= atemp && atemp <= float(b+1)); }\n"
                     );
    }
    if (cmpTypeFound[0x20] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec2 a, uvec2 b) { return (uvec2(floor(a + 0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x21] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec3 a, uvec3 b) { return (uvec3(floor(a + 0.5)) == b); }\n");
    }
    if (cmpTypeFound[0x22] == false) goto LAB_00d676f4;
    pcVar6 = "bool isOk (vec4 a, uvec4 b) { return (uvec4(floor(a + 0.5)) == b); }\n";
  }
  else {
    if (cmpTypeFound[0x23] != false) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bool a, bool b)   { return (a == b); }\n");
    }
    if (cmpTypeFound[0x24] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bvec2 a, bvec2 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x25] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bvec3 a, bvec3 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x26] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bvec4 a, bvec4 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x1b] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (int a, int b)     { return (a == b); }\n");
    }
    if (cmpTypeFound[0x1c] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (ivec2 a, ivec2 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x1d] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (ivec3 a, ivec3 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x1e] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (ivec4 a, ivec4 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x1f] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (uint a, uint b)   { return (a == b); }\n");
    }
    if (cmpTypeFound[0x20] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (uvec2 a, uvec2 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x21] == true) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (uvec3 a, uvec3 b) { return (a == b); }\n");
    }
    if (cmpTypeFound[0x22] != true) goto LAB_00d676f4;
    pcVar6 = "bool isOk (uvec4 a, uvec4 b) { return (a == b); }\n";
  }
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6);
LAB_00d676f4:
  if (cmpTypeFound[1] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (float a, float b, float eps) { return (abs(a-b) <= (eps*abs(b) + eps)); }\n"
                   );
  }
  if (cmpTypeFound[2] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (vec2 a, vec2 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
                   );
  }
  if (cmpTypeFound[3] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (vec3 a, vec3 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
                   );
  }
  if (cmpTypeFound[4] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (vec4 a, vec4 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
                   );
  }
  if (cmpTypeFound[5] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat2 a, mat2 b, float eps) { vec2 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec2(eps))); }\n"
                   );
  }
  if (cmpTypeFound[6] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat2x3 a, mat2x3 b, float eps) { vec3 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec3(eps))); }\n"
                   );
  }
  if (cmpTypeFound[7] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat2x4 a, mat2x4 b, float eps) { vec4 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec4(eps))); }\n"
                   );
  }
  if (cmpTypeFound[8] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat3x2 a, mat3x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec2(eps))); }\n"
                   );
  }
  if (cmpTypeFound[9] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat3 a, mat3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec3(eps))); }\n"
                   );
  }
  if (cmpTypeFound[10] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat3x4 a, mat3x4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec4(eps))); }\n"
                   );
  }
  if (cmpTypeFound[0xb] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat4x2 a, mat4x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec2(eps))); }\n"
                   );
  }
  if (cmpTypeFound[0xc] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat4x3 a, mat4x3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec3(eps))); }\n"
                   );
  }
  if (cmpTypeFound[0xd] == true) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat4 a, mat4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec4(eps))); }\n"
                   );
    return;
  }
  return;
}

Assistant:

static void genCompareFunctions(ostringstream& stream, const ShaderCase::ValueBlock& valueBlock, bool useFloatTypes)
{
	bool cmpTypeFound[TYPE_LAST];
	for (int i			= 0; i < TYPE_LAST; i++)
		cmpTypeFound[i] = false;

	for (int valueNdx = 0; valueNdx < (int)valueBlock.values.size(); valueNdx++)
	{
		const ShaderCase::Value& val = valueBlock.values[valueNdx];
		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
			cmpTypeFound[(int)val.dataType] = true;
	}

	if (useFloatTypes)
	{
		if (cmpTypeFound[TYPE_BOOL])
			stream << "bool isOk (float a, bool b) { return ((a > 0.5) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC2])
			stream << "bool isOk (vec2 a, bvec2 b) { return (greaterThan(a, vec2(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC3])
			stream << "bool isOk (vec3 a, bvec3 b) { return (greaterThan(a, vec3(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC4])
			stream << "bool isOk (vec4 a, bvec4 b) { return (greaterThan(a, vec4(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT])
			stream << "bool isOk (float a, int b)  { float atemp = a+0.5; return (float(b) <= atemp && atemp <= "
					  "float(b+1)); }\n";
		if (cmpTypeFound[TYPE_INT_VEC2])
			stream << "bool isOk (vec2 a, ivec2 b) { return (ivec2(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC3])
			stream << "bool isOk (vec3 a, ivec3 b) { return (ivec3(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC4])
			stream << "bool isOk (vec4 a, ivec4 b) { return (ivec4(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT])
			stream << "bool isOk (float a, uint b) { float atemp = a+0.5; return (float(b) <= atemp && atemp <= "
					  "float(b+1)); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC2])
			stream << "bool isOk (vec2 a, uvec2 b) { return (uvec2(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC3])
			stream << "bool isOk (vec3 a, uvec3 b) { return (uvec3(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC4])
			stream << "bool isOk (vec4 a, uvec4 b) { return (uvec4(floor(a + 0.5)) == b); }\n";
	}
	else
	{
		if (cmpTypeFound[TYPE_BOOL])
			stream << "bool isOk (bool a, bool b)   { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC2])
			stream << "bool isOk (bvec2 a, bvec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC3])
			stream << "bool isOk (bvec3 a, bvec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC4])
			stream << "bool isOk (bvec4 a, bvec4 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT])
			stream << "bool isOk (int a, int b)     { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC2])
			stream << "bool isOk (ivec2 a, ivec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC3])
			stream << "bool isOk (ivec3 a, ivec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC4])
			stream << "bool isOk (ivec4 a, ivec4 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT])
			stream << "bool isOk (uint a, uint b)   { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC2])
			stream << "bool isOk (uvec2 a, uvec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC3])
			stream << "bool isOk (uvec3 a, uvec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC4])
			stream << "bool isOk (uvec4 a, uvec4 b) { return (a == b); }\n";
	}

	if (cmpTypeFound[TYPE_FLOAT])
		stream << "bool isOk (float a, float b, float eps) { return (abs(a-b) <= (eps*abs(b) + eps)); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC2])
		stream
			<< "bool isOk (vec2 a, vec2 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC3])
		stream
			<< "bool isOk (vec3 a, vec3 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC4])
		stream
			<< "bool isOk (vec4 a, vec4 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";

	if (cmpTypeFound[TYPE_FLOAT_MAT2])
		stream << "bool isOk (mat2 a, mat2 b, float eps) { vec2 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT2X3])
		stream << "bool isOk (mat2x3 a, mat2x3 b, float eps) { vec3 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT2X4])
		stream << "bool isOk (mat2x4 a, mat2x4 b, float eps) { vec4 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec4(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3X2])
		stream << "bool isOk (mat3x2 a, mat3x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3])
		stream << "bool isOk (mat3 a, mat3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3X4])
		stream << "bool isOk (mat3x4 a, mat3x4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec4(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4X2])
		stream << "bool isOk (mat4x2 a, mat4x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4X3])
		stream << "bool isOk (mat4x3 a, mat4x3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4])
		stream << "bool isOk (mat4 a, mat4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec4(eps))); }\n";
}